

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O1

bool Kernel::SortHelper::allTopLevelArgsAreSorts(AtomicSort *sort)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = *(uint *)&(sort->super_Term).field_0xc & 0xfffffff;
  uVar3 = (ulong)uVar2;
  bVar5 = uVar2 == 0;
  if (!bVar5) {
    uVar4 = 1;
    do {
      uVar1 = (sort->super_Term)._args[uVar3]._content;
      bVar6 = false;
      if ((uVar1 & 1) == 0) {
        bVar6 = (*(byte *)(uVar1 + 0x28) & 0x20) == 0;
      }
      if (bVar6) {
        return bVar5;
      }
      bVar5 = uVar2 <= uVar4;
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return bVar5;
}

Assistant:

bool SortHelper::allTopLevelArgsAreSorts(AtomicSort* sort)
{
  for(unsigned i = 0; i < sort->arity(); i++){
    TermList arg = *sort->nthArgument(i);
    if(arg.isVar()){
      continue;
    }
    if(!arg.term()->isSort()){
      return false;
    }
  }
  return true;
}